

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void at(tagval *args,int numargs)

{
  char *__n;
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  tagval *ptVar4;
  long lVar5;
  char *__dest;
  int iVar6;
  ulong uVar7;
  anon_union_8_5_08252708_for_identval_0 __s;
  char *start;
  char *end;
  char *list;
  anon_union_8_5_08252708_for_identval_0 local_58;
  char *local_50;
  tagval *local_48;
  ulong local_40;
  anon_union_8_5_08252708_for_identval_0 local_38;
  
  if (numargs != 0) {
    __s.s = "";
    switch(args->type) {
    case 1:
      retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
      local_58.s = retbuf[(uint)retidx];
      stringformatter::operator()
                ((stringformatter *)&local_58,"%d",(ulong)(uint)(args->super_identval).field_0.i);
      __s.s = retbuf[(uint)retidx];
      break;
    case 2:
      __s.s = floatstr((args->super_identval).field_0.f);
      break;
    case 3:
    case 6:
      __s = (anon_union_8_5_08252708_for_identval_0)(args->super_identval).field_0.s;
    }
    local_58 = __s;
    sVar3 = strlen(__s.s);
    local_50 = __s.s + sVar3;
    if (1 < numargs) {
      uVar7 = 1;
      local_48 = args;
      local_40 = (ulong)(uint)numargs;
      do {
        local_38.s = local_58.s;
        if (local_48[uVar7].type - 1U < 6) {
          ptVar4 = local_48 + uVar7;
          switch(local_48[uVar7].type) {
          case 1:
            iVar6 = (ptVar4->super_identval).field_0.i;
            break;
          case 2:
            iVar6 = (int)(ptVar4->super_identval).field_0.f;
            break;
          default:
            lVar5 = strtol((ptVar4->super_identval).field_0.s,(char **)0x0,0);
            iVar6 = (int)lVar5;
            break;
          case 4:
          case 5:
            goto switchD_0012d4a6_caseD_4;
          }
          if (0 < iVar6) {
            iVar6 = iVar6 + 1;
            do {
              bVar2 = parselist(&local_38.s,&liststart,&listend,&listquotestart,&listquoteend);
              if (!bVar2) goto LAB_0012d504;
              iVar6 = iVar6 + -1;
            } while (1 < iVar6);
          }
        }
switchD_0012d4a6_caseD_4:
        bVar2 = parselist(&local_38.s,&local_58.s,&local_50,&listquotestart,&listquoteend);
        if (!bVar2) {
LAB_0012d504:
          local_50 = "";
          local_58.s = "";
        }
        uVar7 = uVar7 + 1;
        __s = local_58;
      } while (uVar7 != local_40);
    }
    pcVar1 = local_50;
    ptVar4 = commandret;
    __n = local_50 + (1 - (long)__s);
    __dest = (char *)operator_new__((ulong)__n);
    strncpy(__dest,__s.s,(size_t)__n);
    pcVar1[(long)__dest - (long)__s] = '\0';
    ptVar4->type = 3;
    (ptVar4->super_identval).field_0.s = __dest;
  }
  return;
}

Assistant:

void at(tagval *args, int numargs)
{
    if(!numargs) return;
    const char *start = args[0].getstr(), *end = start + strlen(start);
    for(int i = 1; i < numargs; i++)
    {
        const char *list = start;
        int pos = args[i].getint();
        for(; pos > 0; pos--) if(!parselist(list)) break;
        if(pos > 0 || !parselist(list, start, end)) start = end = "";
    }
    commandret->setstr(newstring(start, end-start));
}